

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
AlexDataNode(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
             *this,short level,int max_data_node_slots,AlexCompare *comp,
            allocator<std::pair<int,_int>_> *alloc)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  AlexNode<int,_int> *in_R8;
  
  AlexNode<int,_int>::AlexNode(in_R8,(short)((ulong)in_RDI >> 0x30),SUB81((ulong)in_RDI >> 0x28,0));
  *in_RDI = &PTR__AlexDataNode_001b3aa8;
  in_RDI[5] = in_RCX;
  in_RDI[6] = in_R8;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  in_RDI[0xc] = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  in_RDI[0xe] = 0x3ff0000000000000;
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0x10) = in_EDX;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  iVar1 = std::numeric_limits<int>::lowest();
  *(int *)((long)in_RDI + 0xa4) = iVar1;
  iVar1 = std::numeric_limits<int>::max();
  *(int *)(in_RDI + 0x15) = iVar1;
  *(undefined4 *)((long)in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  return;
}

Assistant:

AlexDataNode(short level, int max_data_node_slots,
               const Compare& comp = Compare(), const Alloc& alloc = Alloc())
      : AlexNode<T, P>(level, true),
        key_less_(comp),
        allocator_(alloc),
        max_slots_(max_data_node_slots) {}